

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O3

Iterator * leveldb::NewEmptyIterator(void)

{
  long lVar1;
  EmptyIterator *this;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = (EmptyIterator *)operator_new(0x30);
  anon_unknown_4::EmptyIterator::EmptyIterator(this,(Status *)0x0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return &this->super_Iterator;
  }
  __stack_chk_fail();
}

Assistant:

Iterator* NewEmptyIterator() { return new EmptyIterator(Status::OK()); }